

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O0

vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *
vk::wsi::getPhysicalDeviceSurfacePresentModes
          (vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice,
          VkSurfaceKHR surface)

{
  VkPhysicalDevice pVVar1;
  VkPhysicalDevice pVVar2;
  InstanceInterface *pIVar3;
  VkResult VVar4;
  ulong __n;
  reference pvVar5;
  allocator<vk::VkPresentModeKHR> local_3a;
  undefined1 local_39;
  deUint64 local_38;
  uint local_2c;
  VkPhysicalDevice pVStack_28;
  deUint32 numModes;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  VkSurfaceKHR surface_local;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *modes;
  
  local_2c = 0;
  local_38 = surface.m_internal;
  pVStack_28 = physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vki;
  vki_local = (InstanceInterface *)surface.m_internal;
  surface_local.m_internal = (deUint64)__return_storage_ptr__;
  VVar4 = (*vki->_vptr_InstanceInterface[0x11])(vki,physicalDevice,surface.m_internal,&local_2c,0);
  checkResult(VVar4,
              "vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, DE_NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
              ,299);
  if (local_2c == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::vector
              (__return_storage_ptr__);
  }
  else {
    local_39 = 0;
    __n = (ulong)local_2c;
    std::allocator<vk::VkPresentModeKHR>::allocator(&local_3a);
    std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::vector
              (__return_storage_ptr__,__n,&local_3a);
    std::allocator<vk::VkPresentModeKHR>::~allocator(&local_3a);
    pIVar3 = vki_local;
    pVVar2 = physicalDevice_local;
    pVVar1 = pVStack_28;
    pvVar5 = std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::operator[]
                       (__return_storage_ptr__,0);
    VVar4 = (**(code **)(*(long *)pVVar2 + 0x88))(pVVar2,pVVar1,pIVar3,&local_2c,pvVar5);
    checkResult(VVar4,
                "vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, &modes[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
                ,0x131);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkPresentModeKHR> getPhysicalDeviceSurfacePresentModes (const InstanceInterface&		vki,
																	VkPhysicalDevice				physicalDevice,
																	VkSurfaceKHR					surface)
{
	deUint32	numModes	= 0;

	VK_CHECK(vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, DE_NULL));

	if (numModes > 0)
	{
		std::vector<VkPresentModeKHR>	modes	(numModes);

		VK_CHECK(vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, &modes[0]));

		return modes;
	}
	else
		return std::vector<VkPresentModeKHR>();
}